

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O2

SRes ReadUi32s(CSzData *sd2,UInt32 numItems,CSzBitUi32s *crcs,ISzAlloc *alloc)

{
  Byte *pBVar1;
  UInt32 *pUVar2;
  ulong uVar3;
  UInt32 *pUVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (numItems == 0) {
    crcs->Vals = (UInt32 *)0x0;
    uVar6 = 0;
    pUVar2 = (UInt32 *)0x0;
  }
  else {
    uVar6 = (ulong)numItems;
    pUVar2 = (UInt32 *)(*alloc->Alloc)(alloc,uVar6 * 4);
    crcs->Vals = pUVar2;
    if (pUVar2 == (UInt32 *)0x0) {
      return 2;
    }
  }
  pUVar4 = (UInt32 *)sd2->Data;
  uVar3 = sd2->Size;
  pBVar1 = crcs->Defs;
  uVar5 = 0;
  do {
    if (uVar6 == uVar5) {
      sd2->Data = (Byte *)pUVar4;
      sd2->Size = uVar3;
      return 0;
    }
    if ((char)(pBVar1[uVar5 >> 3 & 0x1fffffff] << ((byte)uVar5 & 7)) < '\0') {
      if (uVar3 < 4) {
        return 0x10;
      }
      pUVar2[uVar5] = *pUVar4;
      uVar3 = uVar3 - 4;
      pUVar4 = pUVar4 + 1;
    }
    else {
      pUVar2[uVar5] = 0;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static MY_NO_INLINE SRes ReadUi32s(CSzData *sd2, UInt32 numItems, CSzBitUi32s *crcs, ISzAlloc *alloc)
{
  UInt32 i;
  CSzData sd;
  UInt32 *vals;
  const Byte *defs;
  MY_ALLOC_ZE(UInt32, crcs->Vals, numItems, alloc);
  sd = *sd2;
  defs = crcs->Defs;
  vals = crcs->Vals;
  for (i = 0; i < numItems; i++)
    if (SzBitArray_Check(defs, i))
    {
      SZ_READ_32(vals[i]);
    }
    else
      vals[i] = 0;
  *sd2 = sd;
  return SZ_OK;
}